

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O0

void leb_SplitNodeConforming_Quad(leb_Heap *leb,leb_Node node)

{
  int32_t iVar1;
  bool bVar2;
  leb_Node node_00;
  leb_Node local_2c;
  leb_Node nodeIterator;
  uint32_t minNodeID;
  leb_Heap *leb_local;
  leb_Node node_local;
  
  bVar2 = leb_IsCeilNode(leb,node);
  if (!bVar2) {
    iVar1 = leb->minDepth;
    leb__SplitNode(leb,node);
    local_2c = leb__EdgeNode_Quad(node);
    while ((uint)(1 << ((byte)iVar1 & 0x1f)) <= local_2c.id) {
      leb__SplitNode(leb,local_2c);
      node_00 = leb_ParentNode(local_2c);
      leb__SplitNode(leb,node_00);
      local_2c = leb__EdgeNode_Quad(node_00);
    }
  }
  return;
}

Assistant:

LEBDEF void leb_SplitNodeConforming_Quad(leb_Heap *leb, const leb_Node node)
{
    if (!leb_IsCeilNode(leb, node)) {
        const uint32_t minNodeID = 1u << leb->minDepth;
        leb_Node nodeIterator = node;

        leb__SplitNode(leb, nodeIterator);
        nodeIterator = leb__EdgeNode_Quad(nodeIterator);

        while (nodeIterator.id >= minNodeID) {
            leb__SplitNode(leb, nodeIterator);
            nodeIterator = leb_ParentNode(nodeIterator);
            leb__SplitNode(leb, nodeIterator);
            nodeIterator = leb__EdgeNode_Quad(nodeIterator);
        }
    }
}